

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall CaPS_SA::Suffix_Array<unsigned_long>::initialize(Suffix_Array<unsigned_long> *this)

{
  unsigned_long *puVar1;
  ostream *poVar2;
  nanoseconds *in_RDI;
  rep_conflict rVar3;
  time_point t_e;
  idx_t_conflict sample_count;
  time_point t_s;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffd8;
  
  std::chrono::_V2::system_clock::now();
  puVar1 = allocate<unsigned_long>(0x10e93c);
  in_RDI[4].__r = (rep)puVar1;
  puVar1 = allocate<unsigned_long>(0x10e950);
  in_RDI[5].__r = (rep)puVar1;
  puVar1 = allocate<unsigned_long>(0x10e970);
  in_RDI[8].__r = (rep)puVar1;
  std::chrono::_V2::system_clock::now();
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "Initialized required data structures. Time taken: ");
  std::chrono::operator-
            (in_stack_ffffffffffffffd8,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)poVar2);
  rVar3 = anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)poVar2,in_RDI);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar3);
  std::operator<<(poVar2," seconds.\n");
  return;
}

Assistant:

void Suffix_Array<T_idx_>::initialize()
{
    const auto t_s = now();

    SA_w = allocate<idx_t>(n_); // Working space for the SA construction.
    LCP_w = allocate<idx_t>(n_);    // Working space for the LCP construction.

    const auto sample_count = p_ * pivot_per_part_;
    pivot_ = allocate<idx_t>(sample_count);

    const auto t_e = now();
    std::cerr << "Initialized required data structures. Time taken: " << duration(t_e - t_s) << " seconds.\n";
}